

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

GLint __thiscall
gl4cts::TextureViewTestViewSampling::getMaxConformantSampleCount
          (TextureViewTestViewSampling *this,GLenum target,GLenum internalFormat)

{
  int iVar1;
  RenderContext *pRVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  void *pvVar7;
  undefined4 in_register_00000014;
  long lVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  GLint isConformant;
  GLint gl_sample_counts;
  int local_3c;
  int local_38;
  int local_34;
  long lVar6;
  
  local_34 = 0;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*pRVar2->_vptr_RenderContext[3])
                    (pRVar2,CONCAT44(in_register_00000034,target),
                     CONCAT44(in_register_00000014,internalFormat));
  lVar6 = CONCAT44(extraout_var,iVar4);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_NV_internalformat_sample_query");
  if (bVar3) {
    local_38 = 0;
    (**(code **)(lVar6 + 0x880))(target,0x8058,0x9380,1,&local_38);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12cb);
    iVar4 = local_38;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (long)local_38) {
      uVar9 = (long)local_38 * 4;
    }
    pvVar7 = operator_new__(uVar9);
    (**(code **)(lVar6 + 0x880))(target,0x8058,0x80a9,iVar4,pvVar7);
    if (local_38 < 1) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      lVar8 = 0;
      do {
        local_3c = 0;
        (**(code **)(lVar6 + 0x870))
                  (target,0x8058,*(undefined4 *)((long)pvVar7 + lVar8 * 4),0x9374,1,&local_3c);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetInternalformatSampleivNV() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x12d8);
        if ((local_3c != 0) && (iVar1 = *(int *)((long)pvVar7 + lVar8 * 4), iVar4 < iVar1)) {
          iVar4 = iVar1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_38);
    }
    operator_delete__(pvVar7);
    local_34 = iVar4;
  }
  else {
    (**(code **)(lVar6 + 0x868))(0x910e,&local_34);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12e6);
  }
  return local_34;
}

Assistant:

glw::GLint TextureViewTestViewSampling::getMaxConformantSampleCount(glw::GLenum target, glw::GLenum internalFormat)
{
	(void)internalFormat;
	glw::GLint max_conformant_samples = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return the max conformant sample count if extension is supported */
	if (m_context.getContextInfo().isExtensionSupported("GL_NV_internalformat_sample_query"))
	{
		glw::GLint gl_sample_counts = 0;
		gl.getInternalformativ(target, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 1, &gl_sample_counts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname");

		/* Check and return the first conformant sample count */
		glw::GLint* gl_supported_samples = new glw::GLint[gl_sample_counts];
		if (gl_supported_samples)
		{
			gl.getInternalformativ(target, GL_RGBA8, GL_SAMPLES, gl_sample_counts, gl_supported_samples);

			for (glw::GLint i = 0; i < gl_sample_counts; i++)
			{
				glw::GLint isConformant = 0;
				gl.getInternalformatSampleivNV(target, GL_RGBA8, gl_supported_samples[i], GL_CONFORMANT_NV, 1,
											   &isConformant);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformatSampleivNV() call(s) failed");

				if (isConformant && gl_supported_samples[i] > max_conformant_samples)
				{
					max_conformant_samples = gl_supported_samples[i];
				}
			}
			delete[] gl_supported_samples;
		}
	}
	else
	{
		/* Otherwise return GL_MAX_COLOR_TEXTURE_SAMPLES */
		gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &max_conformant_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
	}

	return max_conformant_samples;
}